

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBroker_impl.hpp
# Opt level: O3

bool __thiscall
helics::NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11>::
brokerConnect(NetworkBroker<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0,_11> *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_ECX;
  socklen_t __len;
  sockaddr *__addr;
  milliseconds timeOut;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->dataMutex);
  if (iVar3 == 0) {
    if ((this->netInfo).brokerAddress._M_string_length == 0 &&
        (this->netInfo).brokerName._M_string_length == 0) {
      CoreBroker::setAsRoot((CoreBroker *)this);
    }
    bVar1 = (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).super_CoreBroker.
            super_BrokerBase.observer;
    bVar2 = (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).super_CoreBroker.
            super_BrokerBase.useJsonSerialization;
    __len = CONCAT31((int3)((uint)in_ECX >> 8),bVar2);
    (this->netInfo).useJsonSerialization = bVar2;
    (this->netInfo).observer = bVar1;
    CommsInterface::setName
              ((CommsInterface *)
               (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).comms._M_t.
               super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
               .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,
               (string *)
               &(this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).
                super_CoreBroker.super_BrokerBase.identifier);
    tcp::TcpCommsSS::loadNetworkInfo
              ((this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).comms._M_t.
               super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
               .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,&this->netInfo)
    ;
    timeOut.__r = (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).
                  super_CoreBroker.super_BrokerBase.networkTimeout.internalTimeCode / 1000000;
    CommsInterface::setTimeout
              ((CommsInterface *)
               (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).comms._M_t.
               super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
               .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,timeOut);
    iVar3 = CommsInterface::connect
                      ((CommsInterface *)
                       (this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).comms.
                       _M_t.
                       super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
                       .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl,
                       (int)timeOut.__r,__addr,__len);
    if ((SUB41(iVar3,0) != false) && ((this->netInfo).portNumber < 0)) {
      (this->netInfo).portNumber =
           (((this->super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CoreBroker>).comms._M_t.
             super___uniq_ptr_impl<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::tcp::TcpCommsSS_*,_std::default_delete<helics::tcp::TcpCommsSS>_>
             .super__Head_base<0UL,_helics::tcp::TcpCommsSS_*,_false>._M_head_impl)->
           super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->dataMutex);
    return SUB41(iVar3,0);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool NetworkBroker<COMMS, baseline, tcode>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
        CoreBroker::setAsRoot();
    }
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CoreBroker>::comms->setName(CoreBroker::getIdentifier());
    CommsBroker<COMMS, CoreBroker>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CoreBroker>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());

    auto res = CommsBroker<COMMS, CoreBroker>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CoreBroker>::comms->getPort();
        }
    }
    return res;
}